

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_logger.c
# Opt level: O0

mpt_logger * mpt_config_logger(mpt_config *cfg)

{
  int iVar1;
  mpt_config *local_20;
  mpt_logger *info;
  mpt_config *cfg_local;
  
  local_20 = (mpt_config *)0x0;
  info = (mpt_logger *)cfg;
  if (cfg == (mpt_config *)0x0) {
    iVar1 = mpt_config_get((mpt_config *)0x0,"mpt.logger",0x81,&local_20);
    if ((iVar1 < 0) || (local_20 == (mpt_config *)0x0)) {
      mpt_config_get((mpt_config *)0x0,"mpt.output",0x81,&local_20);
      cfg_local = local_20;
    }
    else {
      cfg_local = local_20;
    }
  }
  else {
    iVar1 = mpt_config_getp(cfg,(mpt_path *)0x0,0x81,&local_20);
    if ((iVar1 < 0) || (local_20 == (mpt_config *)0x0)) {
      iVar1 = mpt_config_get((mpt_config *)info,"logger",0x81,&local_20);
      if ((iVar1 < 0) || (local_20 == (mpt_config *)0x0)) {
        mpt_config_get((mpt_config *)info,"output",0x81,&local_20);
        cfg_local = local_20;
      }
      else {
        cfg_local = local_20;
      }
    }
    else {
      cfg_local = local_20;
    }
  }
  return (mpt_logger *)cfg_local;
}

Assistant:

extern MPT_INTERFACE(logger) *mpt_config_logger(const MPT_INTERFACE(config) *cfg)
{
	MPT_INTERFACE(logger) *info = 0;
	
	if (!cfg) {
		/* search global logger */
		if ((mpt_config_get(0, "mpt.logger", MPT_ENUM(TypeLoggerPtr), &info)) >= 0
		    && info) {
			return info;
		}
		/* fallback to compatible 'output' */
		mpt_config_get(0, "mpt.output", MPT_ENUM(TypeLoggerPtr), &info);
		return info;
	}
	/* try direct interface */
	if ((mpt_config_getp(cfg, 0, MPT_ENUM(TypeLoggerPtr), &info)) >= 0
	    && info) {
		return info;
	}
	/* search local logger */
	if ((mpt_config_get(cfg, "logger", MPT_ENUM(TypeLoggerPtr), &info)) >= 0
	    && info) {
		return info;
	}
	/* fallback to compatible 'output' */
	mpt_config_get(cfg, "output", MPT_ENUM(TypeLoggerPtr), &info);
	return info;
}